

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeCommandListAppendLaunchCooperativeKernel
          (ze_command_list_handle_t hCommandList,ze_kernel_handle_t hKernel,
          ze_group_count_t *pLaunchFuncArgs,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  _func_void__ze_command_list_append_launch_cooperative_kernel_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_command_list_handle_t_ptr__ze_kernel_handle_t_ptr__ze_group_count_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_130;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_118;
  undefined1 local_100 [8];
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnCommandListAppendLaunchCooperativeKernelCb_t epilogue_callback_ptr;
  ze_pfnCommandListAppendLaunchCooperativeKernelCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_command_list_append_launch_cooperative_kernel_params_t tracerParams;
  ze_pfnCommandListAppendLaunchCooperativeKernel_t pfnAppendLaunchCooperativeKernel;
  ze_event_handle_t *phWaitEvents_local;
  ze_event_handle_t p_Stack_30;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  ze_group_count_t *pLaunchFuncArgs_local;
  ze_kernel_handle_t hKernel_local;
  ze_command_list_handle_t hCommandList_local;
  
  if (DAT_002da508 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr__ze_kernel_handle_t_ptr__ze_group_count_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnAppendLaunchCooperativeKernel =
         (ze_pfnCommandListAppendLaunchCooperativeKernel_t)phWaitEvents;
    phWaitEvents_local._4_4_ = numWaitEvents;
    p_Stack_30 = hSignalEvent;
    hSignalEvent_local = (ze_event_handle_t)pLaunchFuncArgs;
    pLaunchFuncArgs_local = (ze_group_count_t *)hKernel;
    hKernel_local = (ze_kernel_handle_t)hCommandList;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hKernel_local;
      APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnCommandListAppendLaunchCooperativeKernelCb_t)0x0;
            prologueCallbackPtr < (ze_pfnCommandListAppendLaunchCooperativeKernelCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x2c8);
          p_Var1 = *(_func_void__ze_command_list_append_launch_cooperative_kernel_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x920);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_command_list_append_launch_cooperative_kernel_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_100 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_100
                     );
        }
      }
      zeApiPtr = DAT_002da508;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_118,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_130,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hCommandList_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,_ze_kernel_handle_t*,_ze_group_count_t_const*,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_launch_cooperative_kernel_params_t*,void(*)(_ze_command_list_append_launch_cooperative_kernel_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_cooperative_kernel_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_cooperative_kernel_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_cooperative_kernel_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_cooperative_kernel_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,_ze_kernel_handle_t*&,_ze_group_count_t_const*&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                     (zeApiPtr,(_ze_command_list_append_launch_cooperative_kernel_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_command_list_append_launch_cooperative_kernel_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_118,&local_130,
                      (_ze_command_list_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_kernel_handle_t **)&pLaunchFuncArgs_local,
                      (_ze_group_count_t **)&hSignalEvent_local,&stack0xffffffffffffffd0,
                      (uint *)((long)&phWaitEvents_local + 4),
                      (_ze_event_handle_t ***)&pfnAppendLaunchCooperativeKernel);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_130);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_118);
      APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_cooperative_kernel_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hCommandList_local._4_4_ =
           (*DAT_002da508)((_ze_command_list_handle_t *)hKernel_local,
                           (_ze_kernel_handle_t *)pLaunchFuncArgs_local,
                           (_ze_group_count_t *)hSignalEvent_local,p_Stack_30,
                           phWaitEvents_local._4_4_,
                           (_ze_event_handle_t **)pfnAppendLaunchCooperativeKernel);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendLaunchCooperativeKernel(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        const ze_group_count_t* pLaunchFuncArgs,        ///< [in] thread group launch arguments
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        auto pfnAppendLaunchCooperativeKernel = context.zeDdiTable.CommandList.pfnAppendLaunchCooperativeKernel;

        if( nullptr == pfnAppendLaunchCooperativeKernel)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendLaunchCooperativeKernel, hCommandList, hKernel, pLaunchFuncArgs, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_launch_cooperative_kernel_params_t tracerParams = {
            &hCommandList,
            &hKernel,
            &pLaunchFuncArgs,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendLaunchCooperativeKernelCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendLaunchCooperativeKernelCb_t, CommandList, pfnAppendLaunchCooperativeKernelCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendLaunchCooperativeKernel,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.phKernel,
                                                  *tracerParams.ppLaunchFuncArgs,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }